

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall
Lowerer::GenerateProfiledNewScIntArrayFastPath
          (Lowerer *this,Instr *instr,ArrayCallSiteInfo *arrayInfo,intptr_t arrayInfoAddr,
          intptr_t weakFuncRef)

{
  long lVar1;
  code *pcVar2;
  undefined8 dst;
  bool bVar3;
  AddrOpndKind AVar4;
  uint sourceContextId;
  uint functionId;
  uint32 uVar5;
  uint32 uVar6;
  Opnd *pOVar7;
  AddrOpnd *pAVar8;
  RegOpnd *opnd;
  undefined4 *puVar9;
  size_t sVar10;
  IndirOpnd *src;
  LabelInstr *target;
  LabelInstr *doneLabel;
  Opnd *srcOpnd;
  AutoReuseOpnd autoReuseDstElementsOpnd;
  RegOpnd *dstElementsOpnd;
  uint i;
  undefined1 local_80 [8];
  AutoReuseOpnd autoReuseHeadOpnd;
  RegOpnd *headOpnd;
  RegOpnd *dstOpnd;
  bool isHeadSegmentZeroed;
  uint *puStack_50;
  uint32 size;
  AuxArray<int> *ints;
  AddrOpnd *elementsOpnd;
  LabelInstr *helperLabel;
  Func *func;
  intptr_t weakFuncRef_local;
  intptr_t arrayInfoAddr_local;
  ArrayCallSiteInfo *arrayInfo_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  func = (Func *)weakFuncRef;
  weakFuncRef_local = arrayInfoAddr;
  arrayInfoAddr_local = (intptr_t)arrayInfo;
  arrayInfo_local = (ArrayCallSiteInfo *)instr;
  instr_local = (Instr *)this;
  sourceContextId = Func::GetSourceContextId(this->m_func);
  functionId = Func::GetLocalFunctionId(this->m_func);
  bVar3 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01eafdf0,ArrayLiteralFastPathPhase,sourceContextId,functionId);
  if (((!bVar3) && ((DAT_01ea9ef9 & 1) == 0)) &&
     (bVar3 = Js::ArrayCallSiteInfo::IsNativeIntArray((ArrayCallSiteInfo *)arrayInfoAddr_local),
     bVar3)) {
    pOVar7 = IR::Instr::GetSrc1((Instr *)arrayInfo_local);
    pAVar8 = IR::Opnd::AsAddrOpnd(pOVar7);
    AVar4 = IR::AddrOpnd::GetAddrOpndKind(pAVar8);
    if (AVar4 == AddrOpndKindDynamicAuxBufferRef) {
      helperLabel = (LabelInstr *)this->m_func;
      elementsOpnd = (AddrOpnd *)IR::LabelInstr::New(Label,(Func *)helperLabel,true);
      GenerateArrayInfoIsNativeIntArrayTest
                (this,(Instr *)arrayInfo_local,(ArrayCallSiteInfo *)arrayInfoAddr_local,
                 weakFuncRef_local,(LabelInstr *)elementsOpnd);
      pOVar7 = IR::Instr::GetSrc1((Instr *)arrayInfo_local);
      ints = (AuxArray<int> *)IR::Opnd::AsAddrOpnd(pOVar7);
      puStack_50 = (uint *)((AddrOpnd *)ints)->m_metadata;
      dstOpnd._4_4_ = *puStack_50;
      pOVar7 = IR::Instr::GetDst((Instr *)arrayInfo_local);
      opnd = IR::Opnd::AsRegOpnd(pOVar7);
      uVar5 = Js::JavascriptArray::GetOffsetOfArrayFlags();
      uVar6 = Js::JavascriptNativeArray::GetOffsetOfArrayCallSiteIndex();
      if ((ulong)uVar5 + 2 != (ulong)uVar6) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x1081,
                           "(Js::JavascriptNativeIntArray::GetOffsetOfArrayFlags() + sizeof(uint16) == Js::JavascriptNativeIntArray::GetOffsetOfArrayCallSiteIndex())"
                           ,
                           "Js::JavascriptNativeIntArray::GetOffsetOfArrayFlags() + sizeof(uint16) == Js::JavascriptNativeIntArray::GetOffsetOfArrayCallSiteIndex()"
                          );
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      autoReuseHeadOpnd._16_8_ =
           GenerateArrayLiteralsAlloc<Js::JavascriptNativeIntArray>
                     (this,(Instr *)arrayInfo_local,(uint32 *)((long)&dstOpnd + 4),
                      (ArrayCallSiteInfo *)arrayInfoAddr_local,(bool *)((long)&dstOpnd + 3));
      IR::AutoReuseOpnd::AutoReuseOpnd
                ((AutoReuseOpnd *)local_80,(Opnd *)autoReuseHeadOpnd._16_8_,(Func *)helperLabel,true
                );
      uVar5 = Js::JavascriptNativeArray::GetOffsetOfWeakFuncRef();
      pAVar8 = IR::AddrOpnd::New((intptr_t)func,AddrOpndKindDynamicMisc,this->m_func,false,(Var)0x0)
      ;
      GenerateMemInit(this,opnd,uVar5,&pAVar8->super_Opnd,(Instr *)arrayInfo_local,
                      (bool)(dstOpnd._3_1_ & 1));
      dstElementsOpnd._0_4_ = 0;
      if (*puStack_50 < 0x11) {
        for (; (uint)dstElementsOpnd < *puStack_50;
            dstElementsOpnd._0_4_ = (uint)dstElementsOpnd + 1) {
          GenerateMemInit(this,(RegOpnd *)autoReuseHeadOpnd._16_8_,(uint)dstElementsOpnd * 4 + 0x18,
                          puStack_50[(ulong)(uint)dstElementsOpnd + 1],(Instr *)arrayInfo_local,
                          (bool)(dstOpnd._3_1_ & 1));
        }
      }
      else {
        autoReuseDstElementsOpnd._16_8_ = IR::RegOpnd::New(TyUint64,(Func *)helperLabel);
        IR::AutoReuseOpnd::AutoReuseOpnd
                  ((AutoReuseOpnd *)&srcOpnd,(Opnd *)autoReuseDstElementsOpnd._16_8_,
                   (Func *)helperLabel,true);
        lVar1 = *(long *)(ints + 8);
        sVar10 = Js::AuxArray<int>::OffsetOfElements();
        pAVar8 = IR::AddrOpnd::New(lVar1 + sVar10,AddrOpndKindDynamicMisc,(Func *)helperLabel,false,
                                   (Var)0x0);
        dst = autoReuseDstElementsOpnd._16_8_;
        src = IR::IndirOpnd::New((RegOpnd *)autoReuseHeadOpnd._16_8_,0x18,TyUint64,
                                 (Func *)helperLabel,false);
        InsertLea((RegOpnd *)dst,&src->super_Opnd,(Instr *)arrayInfo_local);
        GenerateMemCopy(this,(Opnd *)autoReuseDstElementsOpnd._16_8_,&pAVar8->super_Opnd,
                        *puStack_50 << 2,(Instr *)arrayInfo_local);
        dstElementsOpnd._0_4_ = *puStack_50;
        IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&srcOpnd);
      }
      if ((uint)dstElementsOpnd != *puStack_50) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x109b,"(i == ints->count)","i == ints->count");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      for (; (uint)dstElementsOpnd < dstOpnd._4_4_;
          dstElementsOpnd._0_4_ = (uint)dstElementsOpnd + 1) {
        GenerateMemInit(this,(RegOpnd *)autoReuseHeadOpnd._16_8_,(uint)dstElementsOpnd * 4 + 0x18,
                        -0x7fffe,(Instr *)arrayInfo_local,(bool)(dstOpnd._3_1_ & 1));
      }
      target = IR::LabelInstr::New(Label,(Func *)helperLabel,false);
      InsertBranch(Br,target,(Instr *)arrayInfo_local);
      IR::Instr::InsertBefore((Instr *)arrayInfo_local,(Instr *)elementsOpnd);
      IR::Instr::InsertAfter((Instr *)arrayInfo_local,&target->super_Instr);
      IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_80);
    }
  }
  return;
}

Assistant:

void
Lowerer::GenerateProfiledNewScIntArrayFastPath(IR::Instr *instr, Js::ArrayCallSiteInfo * arrayInfo, intptr_t arrayInfoAddr, intptr_t weakFuncRef)
{
    // Helper will deal with ForceES5ARray
    if (PHASE_OFF(Js::ArrayLiteralFastPathPhase, m_func) || CONFIG_FLAG(ForceES5Array))
    {
        return;
    }

    if (!arrayInfo->IsNativeIntArray())
    {
        return;
    }

    if (instr->GetSrc1()->AsAddrOpnd()->GetAddrOpndKind() != IR::AddrOpndKindDynamicAuxBufferRef)
    {
        return;
    }

    Func * func = this->m_func;
    IR::LabelInstr * helperLabel = IR::LabelInstr::New(Js::OpCode::Label, func, true);

    GenerateArrayInfoIsNativeIntArrayTest(instr, arrayInfo, arrayInfoAddr, helperLabel);

    IR::AddrOpnd * elementsOpnd = instr->GetSrc1()->AsAddrOpnd();
    Js::AuxArray<int32> * ints = (Js::AuxArray<int32> *)elementsOpnd->m_metadata;
    uint32 size = ints->count;

    // Generate code as in JavascriptArray::NewLiteral
    bool isHeadSegmentZeroed;
    IR::RegOpnd * dstOpnd = instr->GetDst()->AsRegOpnd();
    Assert(Js::JavascriptNativeIntArray::GetOffsetOfArrayFlags() + sizeof(uint16) == Js::JavascriptNativeIntArray::GetOffsetOfArrayCallSiteIndex());
    IR::RegOpnd * headOpnd = GenerateArrayLiteralsAlloc<Js::JavascriptNativeIntArray>(instr, &size, arrayInfo, &isHeadSegmentZeroed);
    const IR::AutoReuseOpnd autoReuseHeadOpnd(headOpnd, func);

    GenerateMemInit(dstOpnd, Js::JavascriptNativeIntArray::GetOffsetOfWeakFuncRef(), IR::AddrOpnd::New(weakFuncRef, IR::AddrOpndKindDynamicMisc, m_func), instr, isHeadSegmentZeroed);

    // Initialize the elements
    uint i = 0;
    if (ints->count > 16)
    {
        // Do memcpy if > 16
        IR::RegOpnd * dstElementsOpnd = IR::RegOpnd::New(TyMachPtr, func);
        const IR::AutoReuseOpnd autoReuseDstElementsOpnd(dstElementsOpnd, func);
        IR::Opnd * srcOpnd = IR::AddrOpnd::New((intptr_t)elementsOpnd->m_address + Js::AuxArray<int32>::OffsetOfElements(), IR::AddrOpndKindDynamicMisc, func);
        InsertLea(dstElementsOpnd, IR::IndirOpnd::New(headOpnd, sizeof(Js::SparseArraySegmentBase), TyMachPtr, func), instr);
        GenerateMemCopy(dstElementsOpnd, srcOpnd, ints->count * sizeof(int32), instr);
        i = ints->count;
    }
    else
    {
        for (; i < ints->count; i++)
        {
            GenerateMemInit(headOpnd, sizeof(Js::SparseArraySegmentBase) + i * sizeof(int32),
                ints->elements[i], instr, isHeadSegmentZeroed);
        }
    }
    Assert(i == ints->count);
    for (; i < size; i++)
    {
        GenerateMemInit(headOpnd, sizeof(Js::SparseArraySegmentBase) + i * sizeof(int32),
            Js::JavascriptNativeIntArray::MissingItem, instr, isHeadSegmentZeroed);
    }
    // Skip pass the helper call
    IR::LabelInstr * doneLabel = IR::LabelInstr::New(Js::OpCode::Label, func);
    InsertBranch(Js::OpCode::Br, doneLabel, instr);
    instr->InsertBefore(helperLabel);

    instr->InsertAfter(doneLabel);
}